

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Run.h
# Opt level: O3

void gurkenlaeufer::runScenario(Scenario *scenario)

{
  ostream *poVar1;
  StepRegistry *registry;
  StepRegistry *registry_00;
  StepRegistry *registry_01;
  ScenarioContext scenarioContext;
  ScenarioContext local_28;
  
  local_28._fixtures.
  super__Vector_base<std::shared_ptr<gurkenlaeufer::detail::IFixture>,_std::allocator<std::shared_ptr<gurkenlaeufer::detail::IFixture>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28._fixtures.
  super__Vector_base<std::shared_ptr<gurkenlaeufer::detail::IFixture>,_std::allocator<std::shared_ptr<gurkenlaeufer::detail::IFixture>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28._fixtures.
  super__Vector_base<std::shared_ptr<gurkenlaeufer::detail::IFixture>,_std::allocator<std::shared_ptr<gurkenlaeufer::detail::IFixture>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(scenario->description)._M_dataplus._M_p,
                      (scenario->description)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  registry = detail::CommonStep<gurkenlaeufer::detail::BaseHook<(gurkenlaeufer::detail::Hooktype)0>>
             ::getStepRegistry_abi_cxx11_();
  detail::
  runStepList<std::__cxx11::list<std::pair<std::__cxx11::string,gurkenlaeufer::detail::BaseHook<(gurkenlaeufer::detail::Hooktype)0>*>,std::allocator<std::pair<std::__cxx11::string,gurkenlaeufer::detail::BaseHook<(gurkenlaeufer::detail::Hooktype)0>*>>>>
            (&local_28,&scenario->tags,registry,true);
  registry_00 = detail::CommonStep<gurkenlaeufer::detail::BaseStep>::getStepRegistry_abi_cxx11_();
  detail::
  runStepList<std::__cxx11::list<std::pair<std::__cxx11::string,gurkenlaeufer::detail::BaseStep*>,std::allocator<std::pair<std::__cxx11::string,gurkenlaeufer::detail::BaseStep*>>>>
            (&local_28,&scenario->mainSteps,registry_00,false);
  registry_01 = detail::
                CommonStep<gurkenlaeufer::detail::BaseHook<(gurkenlaeufer::detail::Hooktype)1>>::
                getStepRegistry_abi_cxx11_();
  detail::
  runStepList<std::__cxx11::list<std::pair<std::__cxx11::string,gurkenlaeufer::detail::BaseHook<(gurkenlaeufer::detail::Hooktype)1>*>,std::allocator<std::pair<std::__cxx11::string,gurkenlaeufer::detail::BaseHook<(gurkenlaeufer::detail::Hooktype)1>*>>>>
            (&local_28,&scenario->tags,registry_01,true);
  std::
  vector<std::shared_ptr<gurkenlaeufer::detail::IFixture>,_std::allocator<std::shared_ptr<gurkenlaeufer::detail::IFixture>_>_>
  ::~vector(&local_28._fixtures);
  return;
}

Assistant:

void runScenario(const Scenario& scenario)
{
    detail::ScenarioContext scenarioContext;
    std::cout << "[" << scenario.description << "]" << std::endl;
    detail::runStepList(scenarioContext, scenario.tags, detail::BaseHook<detail::Hooktype::Before>::getStepRegistry(), true);
    detail::runStepList(scenarioContext, scenario.mainSteps, detail::BaseStep::getStepRegistry(), false);
    detail::runStepList(scenarioContext, scenario.tags, detail::BaseHook<detail::Hooktype::After>::getStepRegistry(), true);
}